

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase31::run(TestCase31 *this)

{
  Reader reader;
  Reader reader_00;
  Builder builder_00;
  PointerType PVar1;
  Builder root;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  MallocMessageBuilder builder;
  StructBuilder in_stack_00000290;
  StructBuilder local_240;
  OrphanBuilder local_218;
  OrphanBuilder local_1f8;
  ushort local_1d4;
  int local_1d0;
  PointerReader local_1c8;
  StructBuilder local_1a8;
  SegmentBuilder *in_stack_fffffffffffffe80;
  CapTableBuilder *in_stack_fffffffffffffe88;
  void *in_stack_fffffffffffffe90;
  WirePointer *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  StructReader local_158;
  StructReader local_128;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1c8,&local_f8.super_MessageBuilder);
  local_1f8.capTable = (CapTableBuilder *)local_1c8.pointer;
  local_1f8.tag.content = (uint64_t)local_1c8.segment;
  local_1f8.segment = (SegmentBuilder *)local_1c8.capTable;
  PointerBuilder::initStruct(&local_240,(PointerBuilder *)&local_1f8,(StructSize)0x140006);
  local_1f8.capTable = (CapTableBuilder *)(local_240.pointers + 2);
  local_1f8.tag.content = (uint64_t)local_240.segment;
  local_1f8.segment = (SegmentBuilder *)local_240.capTable;
  PointerBuilder::initStruct
            ((StructBuilder *)&stack0xfffffffffffffe80,(PointerBuilder *)&local_1f8,
             (StructSize)0x140006);
  builder_00._builder.capTable = in_stack_fffffffffffffe88;
  builder_00._builder.segment = in_stack_fffffffffffffe80;
  builder_00._builder.data = in_stack_fffffffffffffe90;
  builder_00._builder.pointers = in_stack_fffffffffffffe98;
  builder_00._builder.dataSize = (StructDataBitCount)in_stack_fffffffffffffea0;
  builder_00._builder.pointerCount = SUB82(in_stack_fffffffffffffea0,4);
  builder_00._builder._38_2_ = SUB82(in_stack_fffffffffffffea0,6);
  initTestMessage(builder_00);
  local_1f8.capTable = (CapTableBuilder *)(local_240.pointers + 2);
  local_1f8.tag.content = (uint64_t)local_240.segment;
  local_1f8.segment = (SegmentBuilder *)local_240.capTable;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_1f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x24,ERROR,"\"failed: expected \" \"root.hasStructField()\"",
               (char (*) [39])"failed: expected root.hasStructField()");
  }
  local_1c8.pointer = local_240.pointers + 2;
  local_1c8.segment = &(local_240.segment)->super_SegmentReader;
  local_1c8.capTable = &(local_240.capTable)->super_CapTableReader;
  PointerBuilder::disown(&local_1f8,(PointerBuilder *)&local_1c8);
  local_218.capTable = local_1f8.capTable;
  local_218.location = local_1f8.location;
  local_218.tag.content = local_1f8.tag.content;
  local_218.segment = local_1f8.segment;
  if ((local_1f8.location == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x27,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\"",
               (char (*) [38])"failed: expected !(orphan == nullptr)");
  }
  OrphanBuilder::asStructReader(&local_128,&local_218,(StructSize)0x140006);
  reader._reader.capTable = local_128.capTable;
  reader._reader.segment = local_128.segment;
  reader._reader.data = local_128.data;
  reader._reader.pointers = local_128.pointers;
  reader._reader.dataSize = local_128.dataSize;
  reader._reader.pointerCount = local_128.pointerCount;
  reader._reader._38_2_ = local_128._38_2_;
  reader._reader.nestingLimit = local_128.nestingLimit;
  reader._reader._44_4_ = local_128._44_4_;
  checkTestMessage(reader);
  OrphanBuilder::asStruct(&local_1a8,&local_218,(StructSize)0x140006);
  checkTestMessage((Builder)in_stack_00000290);
  local_1f8.capTable = (CapTableBuilder *)(local_240.pointers + 2);
  local_1f8.tag.content = (uint64_t)local_240.segment;
  local_1f8.segment = (SegmentBuilder *)local_240.capTable;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_1f8);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2b,ERROR,"\"failed: expected \" \"!(root.hasStructField())\"",
               (char (*) [42])"failed: expected !(root.hasStructField())");
  }
  local_1f8.capTable = (CapTableBuilder *)(local_240.pointers + 2);
  local_1f8.tag.content = (uint64_t)local_240.segment;
  local_1f8.segment = (SegmentBuilder *)local_240.capTable;
  PointerBuilder::adopt((PointerBuilder *)&local_1f8,&local_218);
  if ((local_218.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2e,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  local_1f8.capTable = (CapTableBuilder *)(local_240.pointers + 2);
  local_1f8.tag.content = (uint64_t)local_240.segment;
  local_1f8.segment = (SegmentBuilder *)local_240.capTable;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_1f8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2f,ERROR,"\"failed: expected \" \"root.hasStructField()\"",
               (char (*) [39])"failed: expected root.hasStructField()");
  }
  StructBuilder::asReader(&local_240);
  if (local_1d4 < 3) {
    local_1d0 = 0x7fffffff;
    local_1c8.capTable = (CapTableReader *)0x0;
    local_1c8.pointer = (WirePointer *)0x0;
    local_1c8.segment = (SegmentReader *)0x0;
  }
  else {
    local_1c8.pointer = (WirePointer *)(local_1f8.location + 2);
    local_1c8.capTable = (CapTableReader *)local_1f8.segment;
    local_1c8.segment = (SegmentReader *)local_1f8.tag.content;
  }
  local_1c8.nestingLimit = local_1d0;
  PointerReader::getStruct(&local_158,&local_1c8,(word *)0x0);
  reader_00._reader.capTable = local_158.capTable;
  reader_00._reader.segment = local_158.segment;
  reader_00._reader.data = local_158.data;
  reader_00._reader.pointers = local_158.pointers;
  reader_00._reader.dataSize = local_158.dataSize;
  reader_00._reader.pointerCount = local_158.pointerCount;
  reader_00._reader._38_2_ = local_158._38_2_;
  reader_00._reader.nestingLimit = local_158.nestingLimit;
  reader_00._reader._44_4_ = local_158._44_4_;
  checkTestMessage(reader_00);
  if (local_218.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_218);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(Orphans, Structs) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  initTestMessage(root.initStructField());
  EXPECT_TRUE(root.hasStructField());

  Orphan<TestAllTypes> orphan = root.disownStructField();
  EXPECT_FALSE(orphan == nullptr);

  checkTestMessage(orphan.getReader());
  checkTestMessage(orphan.get());
  EXPECT_FALSE(root.hasStructField());

  root.adoptStructField(kj::mv(orphan));
  EXPECT_TRUE(orphan == nullptr);
  EXPECT_TRUE(root.hasStructField());
  checkTestMessage(root.asReader().getStructField());
}